

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

bool am_insert_commands_ok_proc(Am_Object *self)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  undefined1 local_78 [8];
  Am_Value_List sel_list;
  Am_Object scroll_menu;
  Am_Object local_58;
  undefined1 local_50 [8];
  Am_Value_List new_cmds;
  Am_Object undo_db;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object script_window;
  Am_Object *self_local;
  
  script_window.data = (Am_Object_Data *)self;
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)self,0x170);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)&local_28);
  Am_Object::~Am_Object(&local_28);
  pAVar3 = Am_Object::Get(&local_20,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object((Am_Object *)&new_cmds.item,pAVar3);
  Am_Object::Get_Object(&local_58,(short)&new_cmds + 8,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar3 = Am_Object::Get(&local_58,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_50,pAVar3);
  Am_Object::~Am_Object(&local_58);
  bVar1 = Am_Value_List::Valid((Am_Value_List *)local_50);
  if (bVar1) {
    pAVar3 = Am_Object::Get(&local_20,Am_UNDO_SCROLL_GROUP,0);
    Am_Object::Am_Object((Am_Object *)&sel_list.item,pAVar3);
    pAVar3 = Am_Object::Get((Am_Object *)&sel_list.item,0x169,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_78,pAVar3);
    bVar1 = Am_Value_List::Valid((Am_Value_List *)local_78);
    if ((bVar1) && (uVar2 = Am_Value_List::Length((Am_Value_List *)local_78), 1 < uVar2)) {
      self_local._7_1_ = false;
    }
    else {
      self_local._7_1_ = true;
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_78);
    Am_Object::~Am_Object((Am_Object *)&sel_list.item);
  }
  else {
    self_local._7_1_ = false;
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
  Am_Object::~Am_Object((Am_Object *)&new_cmds.item);
  Am_Object::~Am_Object(&local_20);
  return self_local._7_1_;
}

Assistant:

Am_Define_Formula(bool, am_insert_commands_ok)
{
  Am_Object script_window = self.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Value_List new_cmds =
      undo_db.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_VALUE);
  if (!new_cmds.Valid())
    return false;
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list = scroll_menu.Get(Am_VALUE);
  if (sel_list.Valid() && sel_list.Length() > 1)
    return false;
  return true;
}